

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_secret(ptls_key_schedule_t *sched,void *secret,char *label)

{
  int iVar1;
  uint8_t *in_RDI;
  char *unaff_retaddr;
  void *in_stack_00000008;
  int ret;
  uint8_t hash_value [64];
  undefined1 local_58 [80];
  
  (**(code **)(*(long *)(in_RDI + 0x60) + 8))(*(undefined8 *)(in_RDI + 0x60),local_58,2);
  iVar1 = derive_secret_with_hash
                    ((ptls_key_schedule_t *)hash_value._0_8_,in_stack_00000008,unaff_retaddr,in_RDI)
  ;
  (*ptls_clear_memory)(local_58,0x40);
  return iVar1;
}

Assistant:

static int derive_secret(ptls_key_schedule_t *sched, void *secret, const char *label)
{
    uint8_t hash_value[PTLS_MAX_DIGEST_SIZE];

    sched->hashes[0].ctx->final(sched->hashes[0].ctx, hash_value, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    int ret = derive_secret_with_hash(sched, secret, label, hash_value);
    ptls_clear_memory(hash_value, sizeof(hash_value));
    return ret;
}